

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O2

void __thiscall
hbm::streaming::Controller::unsubscribe(Controller *this,signalReferences_t *signalReferences)

{
  Value *pVVar1;
  pointer value;
  Value content;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  if ((signalReferences->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (signalReferences->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    Json::Value::Value(&local_f8,nullValue);
    Json::Value::Value(&local_58,"2.0");
    pVVar1 = Json::Value::operator[](&local_f8,"jsonrpc");
    Json::Value::operator=(pVVar1,&local_58);
    Json::Value::~Value(&local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   &this->m_streamId,".unsubscribe");
    Json::Value::Value(&local_80,(string *)&local_d0);
    pVVar1 = Json::Value::operator[](&local_f8,"method");
    Json::Value::operator=(pVVar1,&local_80);
    Json::Value::~Value(&local_80);
    std::__cxx11::string::~string((string *)&local_d0);
    for (value = (signalReferences->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        value != (signalReferences->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
      pVVar1 = Json::Value::operator[](&local_f8,"params");
      Json::Value::Value(&local_d0,value);
      Json::Value::append(pVVar1,&local_d0);
      Json::Value::~Value(&local_d0);
    }
    s_id = s_id + 1;
    Json::Value::Value(&local_a8,s_id);
    pVVar1 = Json::Value::operator[](&local_f8,anon_var_dwarf_12a1c + 0x27);
    Json::Value::operator=(pVVar1,&local_a8);
    Json::Value::~Value(&local_a8);
    execute(this,&local_f8);
    Json::Value::~Value(&local_f8);
  }
  return;
}

Assistant:

void Controller::unsubscribe(const signalReferences_t &signalReferences)
		{
			if(signalReferences.empty()) {
				return;
			}
			Json::Value content;
			content[JSONRPC] = "2.0";
			content[METHOD] = m_streamId +".unsubscribe";
			for(signalReferences_t::const_iterator iter = signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
				content[PARAMS].append(*iter);
			}
			content["id"] = ++s_id;

			execute(content);
		}